

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O3

string * stripPrefix(string *__return_storage_ptr__,string *value,string *prefix)

{
  pointer pcVar1;
  ulong __n;
  int iVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + value->_M_string_length);
  __n = prefix->_M_string_length;
  if ((__n <= __return_storage_ptr__->_M_string_length) &&
     ((__n == 0 ||
      (iVar2 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,(prefix->_M_dataplus)._M_p,__n),
      iVar2 == 0)))) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (__return_storage_ptr__,0,__n);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string stripPrefix( std::string const & value, std::string const & prefix )
{
  std::string strippedValue = value;
  if ( strippedValue.starts_with( prefix ) )
  {
    strippedValue.erase( 0, prefix.length() );
  }
  return strippedValue;
}